

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>
::Map<TTD::ThreadContextTTD::CleanRecordWeakRootMap()::__0>
          (WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>
           *this)

{
  bool bVar1;
  int iVar2;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar3;
  int **ppiVar4;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> **ppWVar5;
  RecyclerWeakReference<Js::RecyclableObject> *this_00;
  RecyclableObject *key_00;
  RecyclerWeakReference<Js::RecyclableObject> **ppRVar6;
  int nextIndex;
  RecyclableObject *key;
  EntryType *currentEntry;
  int local_20;
  int currentIndex;
  int previousIndex;
  int i;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_local;
  
  for (currentIndex = 0; currentIndex < *(int *)this; currentIndex = currentIndex + 1) {
    ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
    if ((*ppiVar4)[currentIndex] != -1) {
      local_20 = -1;
      ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
      currentEntry._4_4_ = (*ppiVar4)[currentIndex];
      while (currentEntry._4_4_ != -1) {
        ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)(this + 0x10));
        pWVar3 = *ppWVar5;
        this_00 = Memory::
                  WriteBarrierPtr<const_Memory::RecyclerWeakReference<Js::RecyclableObject>_>::
                  operator->(&pWVar3[currentEntry._4_4_].key);
        key_00 = Memory::RecyclerWeakReference<Js::RecyclableObject>::Get(this_00);
        if (key_00 == (RecyclableObject *)0x0) {
          iVar2 = pWVar3[currentEntry._4_4_].next;
          WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
          ::RemoveEntry((WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
                         *)this,currentEntry._4_4_,local_20,currentIndex);
          currentEntry._4_4_ = iVar2;
        }
        else {
          bVar1 = pWVar3[currentEntry._4_4_].value;
          ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                              ((WriteBarrierPtr *)&pWVar3[currentEntry._4_4_].key);
          TTD::ThreadContextTTD::CleanRecordWeakRootMap::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&this_local + 7),key_00,(bool)(bVar1 & 1),
                     *ppRVar6);
          local_20 = currentEntry._4_4_;
          currentEntry._4_4_ = pWVar3[currentEntry._4_4_].next;
        }
      }
    }
  }
  return;
}

Assistant:

void Map(Fn fn)
        {
            for(int i = 0; i < size; i++)
            {
                if(buckets[i] != -1)
                {
                    for(int previousIndex = -1, currentIndex = buckets[i]; currentIndex != -1;)
                    {
                        EntryType &currentEntry = entries[currentIndex];
                        TKey * key = currentEntry.key->Get();
                        if(key != nullptr)
                        {
                            fn(key, currentEntry.value, currentEntry.key);

                            // Keep the entry
                            previousIndex = currentIndex;
                            currentIndex = currentEntry.next;
                        }
                        else
                        {
                            // Remove the entry
                            const int nextIndex = currentEntry.next;
                            RemoveEntry(currentIndex, previousIndex, i);
                            currentIndex = nextIndex;
                        }
                    }
                }
            }
        }